

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int string_cmp_string(http_string_t string_a,http_string_t string_b)

{
  int iVar1;
  
  if (string_a.len == string_b.len) {
    iVar1 = nh_string_cmp(string_a.value,string_b.value,(int)string_a.len);
    return iVar1;
  }
  return 0;
}

Assistant:

int string_cmp_string(http_string_t string_a, http_string_t string_b) {
    return string_a.len == string_b.len && nh_string_cmp(string_a.value, string_b.value, string_a.len);
}